

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Ym2612.cpp
# Opt level: O1

void LibGens::Ym2612Private::doStaticInit(void)

{
  double dVar1;
  int iVar2;
  int *piVar3;
  int i_3;
  ulong uVar4;
  int i_2;
  int i_1;
  int i;
  long lVar5;
  long lVar6;
  double dVar7;
  
  SIN_TAB._0_8_ = &TL_TAB + PG_CUT_OFF;
  lVar5 = 1;
  lVar6 = 0x7ff;
  SIN_TAB._16384_8_ = SIN_TAB._0_8_;
  do {
    dVar7 = sin((double)(int)lVar5 * 6.283185307179586 * 0.000244140625);
    dVar7 = log10(1.0 / dVar7);
    iVar2 = (int)((dVar7 * 20.0) / 0.0234375);
    if (PG_CUT_OFF < iVar2) {
      iVar2 = PG_CUT_OFF;
    }
    *(undefined4 **)(SIN_TAB + lVar6 * 8) = &TL_TAB + iVar2;
    *(undefined4 **)(SIN_TAB + lVar5 * 8) = &TL_TAB + iVar2;
    *(undefined4 **)(SIN_TAB + lVar6 * 8 + 0x4000) = &DAT_002441c0 + iVar2;
    *(undefined4 **)(SIN_TAB + lVar5 * 8 + 0x4000) = &DAT_002441c0 + iVar2;
    lVar5 = lVar5 + 1;
    lVar6 = lVar6 + -1;
  } while (lVar6 != 0x3ff);
  lVar6 = 0;
  lVar5 = 0;
  do {
    dVar7 = (double)(int)lVar5 * 6.283185307179586 * 0.0009765625;
    dVar1 = sin(dVar7);
    *(int *)((long)&LFO_ENV_TAB + lVar6) = (int)((dVar1 + 1.0) * 0.5 * 503.4666666666667);
    dVar7 = sin(dVar7);
    *(int *)((long)&LFO_FREQ_TAB + lVar6) = (int)(dVar7 * 511.0);
    lVar5 = lVar5 + 1;
    lVar6 = lVar6 + 4;
  } while (lVar5 != 0x400);
  iVar2 = 0xfff;
  lVar5 = 0;
  do {
    dVar7 = (double)iVar2 * 0.000244140625 * (double)iVar2 * 0.000244140625;
    dVar7 = dVar7 * dVar7;
    (&ENV_TAB)[lVar5] = (int)(dVar7 * dVar7 * 4096.0);
    (&DAT_002541c0)[lVar5] = (int)((double)(int)lVar5 * 0.000244140625 * 4096.0);
    lVar5 = lVar5 + 1;
    iVar2 = iVar2 + -1;
  } while (lVar5 != 0x1000);
  _DAT_002581c0 = 0xfff;
  iVar2 = 0xfff;
  uVar4 = 0;
  do {
    if (iVar2 != 0) {
      lVar5 = 0;
      do {
        if (uVar4 <= (uint)(&ENV_TAB)[lVar5 + iVar2]) {
          iVar2 = iVar2 + (int)lVar5;
          goto LAB_00165d2d;
        }
        lVar5 = lVar5 + -1;
      } while (-lVar5 != (long)iVar2);
      iVar2 = 0;
    }
LAB_00165d2d:
    (&DECAY_TO_ATTACK)[uVar4] = iVar2 << 0x10;
    uVar4 = uVar4 + 1;
    if (uVar4 == 0x1000) {
      piVar3 = &SL_TAB;
      lVar5 = 0;
      do {
        *piVar3 = (int)((double)(int)lVar5 / 0.0234375) * 0x10000 + 0x10000000;
        lVar5 = lVar5 + 3;
        piVar3 = piVar3 + 1;
      } while (lVar5 != 0x2d);
      _DAT_002941fc = 0x1fff0000;
      lVar5 = 0;
      do {
        if (lVar5 < PG_CUT_OFF) {
          dVar7 = pow(10.0,((double)(int)lVar5 * 0.0234375) / 20.0);
          (&TL_TAB)[lVar5] = (int)(268435455.0 / dVar7);
          iVar2 = -(int)(268435455.0 / dVar7);
        }
        else {
          (&TL_TAB)[lVar5] = 0;
          iVar2 = 0;
        }
        (&DAT_002441c0)[lVar5] = iVar2;
        lVar5 = lVar5 + 1;
      } while (lVar5 != 0x3000);
      NULL_RATE._112_8_ = 0;
      NULL_RATE._120_8_ = 0;
      NULL_RATE._96_8_ = 0;
      NULL_RATE._104_8_ = 0;
      NULL_RATE._80_8_ = 0;
      NULL_RATE._88_8_ = 0;
      NULL_RATE._64_8_ = 0;
      NULL_RATE._72_8_ = 0;
      NULL_RATE._48_8_ = 0;
      NULL_RATE._56_8_ = 0;
      NULL_RATE._32_8_ = 0;
      NULL_RATE._40_8_ = 0;
      NULL_RATE._16_8_ = 0;
      NULL_RATE._24_8_ = 0;
      NULL_RATE._0_8_ = 0;
      NULL_RATE._8_8_ = 0;
      return;
    }
  } while( true );
}

Assistant:

void Ym2612Private::doStaticInit(void)
{
	// Sine table:
	// SIN_TAB[x][y] = sin(x) * y;
	// x = phase and y = volume
	SIN_TAB[0] = SIN_TAB[SIN_LENGTH / 2] = &TL_TAB[(int)PG_CUT_OFF];

	for (int i = 1; i <= SIN_LENGTH / 4; i++) {
		double x = sin(2.0 * PI * (double) (i) / (double) (SIN_LENGTH));	// Sinus
		x = 20 * log10(1 / x);	// convert to dB

		int j = (int)(x / ENV_STEP);	// Get TL range
		if (j > PG_CUT_OFF) {
			j = (int) PG_CUT_OFF;
		}

		SIN_TAB[i] = SIN_TAB[(SIN_LENGTH / 2) - i] = &TL_TAB[j];
		SIN_TAB[(SIN_LENGTH / 2) + i] = SIN_TAB[SIN_LENGTH - i] = &TL_TAB[TL_LENGTH + j];

//		LOG_MSG(ym2612, LOG_MSG_LEVEL_DEBUG3,
//			"SIN[%d][0] = %.8X    SIN[%d][0] = %.8X    SIN[%d][0] = %.8X    SIN[%d][0] = %.8X",
//			i, SIN_TAB[i][0], (SIN_LENGTH / 2) - i,
//			SIN_TAB[(SIN_LENGTH / 2) - i][0], (SIN_LENGTH / 2) + i,
//			SIN_TAB[(SIN_LENGTH / 2) + i][0], SIN_LENGTH - i,
//			SIN_TAB[SIN_LENGTH - i][0]);
	}

	// LFO table:
	for (int i = 0; i < LFO_LENGTH; i++) {
		double x = sin (2.0 * PI * (double) (i) / (double) (LFO_LENGTH));	// Sinus
		x += 1.0;
		x /= 2.0;		// positive only
		x *= 11.8 / ENV_STEP;	// adjusted to MAX envelope modulation

		LFO_ENV_TAB[i] = (int) x;

		x = sin(2.0 * PI * (double) (i) / (double) (LFO_LENGTH));	// Sinus
		x *= (double) ((1 << (LFO_HBITS - 1)) - 1);

		LFO_FREQ_TAB[i] = (int) x;

//		LOG_MSG(ym2612, LOG_MSG_LEVEL_DEBUG3,
//			"LFO[%d] = %.8X", i, LFO_ENV_TAB[i]);
	}

	// Envelope table:
	// ENV_TAB[0] -> ENV_TAB[ENV_LENGTH - 1]              = attack curve
	// ENV_TAB[ENV_LENGTH] -> ENV_TAB[2 * ENV_LENGTH - 1] = decay curve
	for (int i = 0; i < ENV_LENGTH; i++) {
		// Attack curve (x^8 - music level 2 Vectorman 2)
		double x = pow(((double)((ENV_LENGTH - 1) - i) / (double)(ENV_LENGTH)), 8);
		x *= ENV_LENGTH;

		ENV_TAB[i] = (int)x;

		// Decay curve (just linear)
		x = pow(((double) (i) / (double) (ENV_LENGTH)), 1);
		x *= ENV_LENGTH;

		ENV_TAB[ENV_LENGTH + i] = (int)x;

//		LOG_MSG(ym2612, LOG_MSG_LEVEL_DEBUG3,
//			"ATTACK[%d] = %d   DECAY[%d] = %d",
//			i, ENV_TAB[i], i, ENV_TAB[ENV_LENGTH + i]);
	}

	ENV_TAB[ENV_END >> ENV_LBITS] = ENV_LENGTH - 1;	// for the stopped state

	// Decay -> Attack table.
	// NOTE: There used to be an Attack -> Decay table,
	// but it wasn't implemented as of the original
	// port of Gens for Linux...
	for (int i = 0, j = ENV_LENGTH - 1; i < ENV_LENGTH; i++) {
		while (j && (ENV_TAB[j] < (unsigned) i))
			j--;

		DECAY_TO_ATTACK[i] = j << ENV_LBITS;
	}

	// Sustain Level table:
	for (int i = 0; i < 15; i++) {
		double x = i * 3;		// 3 and not 6 (Mickey Mania first music for test)
		x /= ENV_STEP;

		int j = (int)x;
		j <<= ENV_LBITS;

		SL_TAB[i] = j + ENV_DECAY;
	}

	int j = ENV_LENGTH - 1;		// special case : volume off
	j <<= ENV_LBITS;
	SL_TAB[15] = j + ENV_DECAY;

	// TL table:
	// [0     -  4095] = +output  [4095  - ...] = +output overflow (fill with 0)
	// [12288 - 16383] = -output  [16384 - ...] = -output overflow (fill with 0)
	for (int i = 0; i < TL_LENGTH; i++) {
		if (i >= PG_CUT_OFF) {
			// YM2612 cut off sound after 78 dB (14 bits output ?)
			TL_TAB[TL_LENGTH + i] = TL_TAB[i] = 0;
		} else {
			double x = MAX_OUT;			// Max output
			x /= pow(10, (ENV_STEP * i) / 20);	// Decibel -> Voltage

			TL_TAB[i] = (int) x;
			TL_TAB[TL_LENGTH + i] = -TL_TAB[i];
		}

//		LOG_MSG(ym2612, LOG_MSG_LEVEL_DEBUG3,
//			"TL_TAB[%d] = %.8X    TL_TAB[%d] = %.8X",
//			i, TL_TAB[i], TL_LENGTH + i, TL_TAB[TL_LENGTH + i]);
	}

	// NULL frequency rate table.
	// It's always 0.
	memset(NULL_RATE, 0, sizeof(NULL_RATE));
}